

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlAddPrevSibling(xmlNodePtr next,xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  
  pxVar1 = (xmlNodePtr)0x0;
  if ((((next != (xmlNodePtr)0x0) && (cur != (xmlNodePtr)0x0)) && (next->type != XML_NAMESPACE_DECL)
      ) && (((pxVar1 = (xmlNodePtr)0x0, cur != next && (cur->type != XML_NAMESPACE_DECL)) &&
            (pxVar1 = cur, next->prev != cur)))) {
    pxVar1 = xmlInsertNode(next->doc,cur,next->parent,next->prev,next,0);
    return pxVar1;
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlAddPrevSibling(xmlNodePtr next, xmlNodePtr cur) {
    if ((next == NULL) || (next->type == XML_NAMESPACE_DECL) ||
        (cur == NULL) || (cur->type == XML_NAMESPACE_DECL) ||
        (cur == next))
	return(NULL);

    if (cur == next->prev)
        return(cur);

    return(xmlInsertNode(next->doc, cur, next->parent, next->prev, next, 0));
}